

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

void __thiscall
cinatra::coro_http_client::coro_http_client(coro_http_client *this,executor_type *executor)

{
  element_type *peVar1;
  basic_executor_type<std::allocator<void>,_0UL> *in_RSI;
  long in_RDI;
  config *this_00;
  duration<long,_std::ratio<1L,_1L>_> *__d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  http_parser *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_executor_type<std::allocator<void>,_0UL> *in_stack_ffffffffffffff28;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  basic_executor_type<std::allocator<void>,_0UL> *in_stack_ffffffffffffff48;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
  *in_stack_ffffffffffffff50;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
  *in_stack_ffffffffffffff58;
  period_timer *in_stack_ffffffffffffff60;
  int local_44;
  duration<long,std::ratio<1l,1l>> local_40 [12];
  int local_34;
  duration<long,std::ratio<1l,1l>> local_30 [11];
  allocator<char> local_25 [13];
  basic_executor_type<std::allocator<void>,_0UL> local_18 [3];
  
  std::enable_shared_from_this<cinatra::coro_http_client>::enable_shared_from_this
            ((enable_shared_from_this<cinatra::coro_http_client> *)0x458854);
  http_parser::http_parser(in_stack_ffffffffffffff00);
  asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::basic_executor_type
            (local_18,in_RSI);
  coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::
  ExecutorWrapper(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  asio::io_context::basic_executor_type<std::allocator<void>,_0UL>::~basic_executor_type(local_18);
  coro_io::period_timer::
  period_timer<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::
  make_shared<cinatra::coro_http_client::socket_t,asio::io_context::basic_executor_type<std::allocator<void>,0ul>&>
            (in_stack_ffffffffffffff28);
  peVar1 = std::
           __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x45892b);
  *(streambuf **)(in_RDI + 0xde8) = &peVar1->head_buf_;
  peVar1 = std::
           __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x45894b);
  *(streambuf **)(in_RDI + 0xdf0) = &peVar1->chunked_buf_;
  std::__cxx11::string::string(in_stack_ffffffffffffff10);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x45898a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  std::allocator<char>::~allocator(local_25);
  this_00 = (config *)(in_RDI + 0xe70);
  std::__cxx11::string::string(in_stack_ffffffffffffff10);
  __d = (duration<long,_std::ratio<1L,_1L>_> *)(in_RDI + 0xe90);
  std::__cxx11::string::string(in_stack_ffffffffffffff10);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xeb0);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::multipart_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::multipart_t>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::multipart_t,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cinatra::multipart_t>_>_>
         *)0x458a70);
  *(undefined8 *)(in_RDI + 0xf40) = 0x100000;
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  *(undefined1 *)(in_RDI + 0xfc8) = 0;
  local_34 = 0x1e;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_30,&local_34);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)this_01,__d);
  local_44 = 0x3c;
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_40,&local_44);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)this_01,__d);
  *(undefined1 *)(in_RDI + 0xfe0) = 1;
  std::__cxx11::string::string(this_01);
  std::span<char,_18446744073709551615UL>::span((span<char,_18446744073709551615UL> *)0x458ba5);
  *(undefined1 *)(in_RDI + 0x1018) = 0;
  config::config(this_00);
  *(undefined1 *)(in_RDI + 0x1110) = 0;
  *(undefined1 *)(in_RDI + 0x1111) = 0;
  std::__cxx11::string::string(this_01);
  *(undefined4 *)(in_RDI + 0x1138) = 3;
  *(undefined8 *)(in_RDI + 0x1140) = 0x100000000;
  std::__cxx11::string::string(this_01);
  *(undefined1 *)(in_RDI + 0x1168) = 0;
  *(undefined1 *)(in_RDI + 0x1169) = 0;
  *(undefined1 *)(in_RDI + 0x116a) = 0;
  *(undefined1 *)(in_RDI + 0x116b) = 0;
  *(undefined1 *)(in_RDI + 0x116c) = 0;
  *(undefined1 *)(in_RDI + 0x116d) = 0;
  *(undefined1 *)(in_RDI + 0x116e) = 0;
  return;
}

Assistant:

coro_http_client(asio::io_context::executor_type executor)
      : executor_wrapper_(executor),
        timer_(&executor_wrapper_),
        socket_(std::make_shared<socket_t>(executor)),
        head_buf_(socket_->head_buf_),
        chunked_buf_(socket_->chunked_buf_) {}